

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

PaddingLayerParams_PaddingConstant * __thiscall
CoreML::Specification::PaddingLayerParams::mutable_constant(PaddingLayerParams *this)

{
  PaddingLayerParams_PaddingConstant *this_00;
  
  if (this->_oneof_case_[0] == 1) {
    this_00 = (this->PaddingType_).constant_;
  }
  else {
    clear_PaddingType(this);
    this->_oneof_case_[0] = 1;
    this_00 = (PaddingLayerParams_PaddingConstant *)operator_new(0x18);
    PaddingLayerParams_PaddingConstant::PaddingLayerParams_PaddingConstant(this_00);
    (this->PaddingType_).constant_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::PaddingLayerParams_PaddingConstant* PaddingLayerParams::mutable_constant() {
  if (!has_constant()) {
    clear_PaddingType();
    set_has_constant();
    PaddingType_.constant_ = new ::CoreML::Specification::PaddingLayerParams_PaddingConstant;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.PaddingLayerParams.constant)
  return PaddingType_.constant_;
}